

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O2

ExpressionResult * __thiscall
iutest::detail::ExpressionResult::operator&&
          (ExpressionResult *__return_storage_ptr__,ExpressionResult *this,bool *rhs)

{
  AssertionResult *pAVar1;
  pointer local_40;
  AssertionResult local_38;
  
  local_38.m_result = (bool)0;
  if ((this->m_result).m_result != false) {
    local_38.m_result = *rhs;
  }
  local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
  local_38.m_message._M_string_length = 0;
  local_38.m_message.field_2._M_local_buf[0] = '\0';
  local_40 = (this->m_result).m_message._M_dataplus._M_p;
  pAVar1 = AssertionResult::operator<<(&local_38,&local_40);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" && ");
  pAVar1 = AssertionResult::operator<<(pAVar1,rhs);
  AssertionResult::AssertionResult(&__return_storage_ptr__->m_result,pAVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

IIUT_DECL_EXPRESSION_RESULT_OP(||)
    IIUT_DECL_EXPRESSION_RESULT_OP(&&)

public:
    AssertionResult GetResult(bool expected) const
    {
        return AssertionResult(result() == expected) << "expansion: " << m_result.message();
    }